

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Functional::FboRenderTestGroup::init(FboRenderTestGroup *this,EVP_PKEY_CTX *ctx)

{
  GLenum GVar1;
  Context *pCVar2;
  _func_int **pp_Var3;
  int extraout_EAX;
  TestNode *pTVar4;
  TestNode *pTVar5;
  MixTest *pMVar6;
  BlendTest *pBVar7;
  IntersectingQuadsTest *pIVar8;
  StencilTest *pSVar9;
  RecreateBuffersTest<16384U> *pRVar10;
  RecreateBuffersTest<256U> *pRVar11;
  RecreateBuffersTest<1024U> *pRVar12;
  TestNode *pTVar13;
  int stencilbufferNdx;
  long lVar14;
  int stencilbufferNdx_3;
  GLenum GVar15;
  GLenum GVar16;
  GLenum GVar17;
  byte bVar18;
  int stencilbufferNdx_5;
  int stencilbufferNdx_1;
  long lVar19;
  int stencilbufferNdx_2;
  FboConfig local_88;
  TestNode *local_68;
  TestNode *local_60;
  TestNode *local_58;
  long local_50;
  TestNode *local_48;
  long local_40;
  long local_38;
  
  pTVar4 = (TestNode *)operator_new(0x78);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,pCVar2->m_testCtx,"color_clear","Color buffer clears");
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00781de0;
  pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
  local_48 = (TestNode *)this;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  lVar14 = 0;
  do {
    local_58 = (TestNode *)CONCAT44(local_58._4_4_,(&DAT_0066c810)[lVar14 * 2]);
    GVar15 = (&DAT_0066c814)[lVar14 * 2];
    lVar19 = 0;
    local_68 = (TestNode *)lVar14;
    do {
      GVar1 = (&DAT_0066c860)[lVar19 * 2];
      GVar17 = (&DAT_0066c864)[lVar19 * 2];
      lVar14 = 0;
      local_60 = (TestNode *)lVar19;
      do {
        local_88.colorbufferFormat = GVar15;
        local_88.colorbufferType = (GLenum)local_58;
        local_88.depthbufferFormat = GVar17;
        local_88.depthbufferType = GVar1;
        local_88._16_8_ = (&DAT_0066c870)[lVar14];
        pTVar5 = (TestNode *)operator_new(0x90);
        FboCases::ColorClearsTest::ColorClearsTest
                  ((ColorClearsTest *)pTVar5,(Context *)pTVar4[1]._vptr_TestNode,&local_88);
        tcu::TestNode::addChild(pTVar4,pTVar5);
        lVar14 = lVar14 + 1;
      } while (lVar14 == 1);
      lVar19 = (long)local_60 + 1;
    } while (local_60 == (TestNode *)0x0);
    lVar14 = (long)local_68 + 1;
  } while (lVar14 != 5);
  pTVar5 = (TestNode *)operator_new(0x78);
  pTVar4 = local_48;
  pp_Var3 = local_48[1]._vptr_TestNode;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,(TestContext *)*pp_Var3,"stencil_clear","Stencil buffer clears"
            );
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_00781de0;
  pTVar5[1]._vptr_TestNode = pp_Var3;
  local_60 = pTVar5;
  tcu::TestNode::addChild(pTVar4,pTVar5);
  pTVar4 = local_60;
  lVar14 = 0;
  do {
    local_58 = (TestNode *)CONCAT44(local_58._4_4_,(&DAT_0066c810)[lVar14 * 2]);
    GVar15 = (&DAT_0066c814)[lVar14 * 2];
    lVar19 = 0;
    local_50 = lVar14;
    do {
      GVar1 = (&DAT_0066c860)[lVar19 * 2];
      GVar17 = (&DAT_0066c864)[lVar19 * 2];
      lVar14 = 0;
      local_68 = (TestNode *)lVar19;
      do {
        local_88.colorbufferFormat = GVar15;
        local_88.colorbufferType = (GLenum)local_58;
        local_88.depthbufferFormat = GVar17;
        local_88.depthbufferType = GVar1;
        local_88.stencilbufferFormat = *(GLenum *)((long)&DAT_0066c870 + lVar14 * 8 + 4);
        local_88.stencilbufferType = *(GLenum *)(&DAT_0066c870 + lVar14);
        if (*(GLenum *)(&DAT_0066c870 + lVar14) != 0) {
          pTVar5 = (TestNode *)operator_new(0x90);
          FboCases::StencilClearsTest::StencilClearsTest
                    ((StencilClearsTest *)pTVar5,(Context *)pTVar4[1]._vptr_TestNode,&local_88);
          tcu::TestNode::addChild(pTVar4,pTVar5);
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 == 1);
      lVar19 = (long)local_68 + 1;
    } while (local_68 == (TestNode *)0x0);
    lVar14 = local_50 + 1;
  } while (lVar14 != 5);
  pTVar5 = (TestNode *)operator_new(0x78);
  pTVar4 = local_48;
  pp_Var3 = local_48[1]._vptr_TestNode;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,(TestContext *)*pp_Var3,"color","Color buffer tests");
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_00781de0;
  pTVar5[1]._vptr_TestNode = pp_Var3;
  local_58 = pTVar5;
  tcu::TestNode::addChild(pTVar4,pTVar5);
  pTVar4 = local_58;
  local_50 = 0;
  do {
    GVar15 = (&DAT_0066c810)[local_50 * 2];
    GVar1 = (&DAT_0066c814)[local_50 * 2];
    lVar14 = 0;
    local_60 = (TestNode *)CONCAT44(local_60._4_4_,GVar15);
    do {
      GVar17 = (&DAT_0066c860)[lVar14 * 2];
      GVar16 = (&DAT_0066c864)[lVar14 * 2];
      lVar19 = 0;
      local_68 = (TestNode *)lVar14;
      do {
        local_88.colorbufferFormat = GVar1;
        local_88.colorbufferType = GVar15;
        local_88.depthbufferFormat = GVar16;
        local_88.depthbufferType = GVar17;
        local_88.stencilbufferFormat = *(GLenum *)((long)&DAT_0066c870 + lVar19 * 8 + 4);
        local_88.stencilbufferType = *(GLenum *)(&DAT_0066c870 + lVar19);
        if ((GVar15 == 0xde1) && (*(GLenum *)(&DAT_0066c870 + lVar19) == 0)) {
          pMVar6 = (MixTest *)operator_new(0xa0);
          FboCases::MixTest::MixTest(pMVar6,(Context *)pTVar4[1]._vptr_TestNode,&local_88,false);
          tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar6);
          GVar15 = (GLenum)local_60;
        }
        pTVar5 = local_58;
        lVar19 = lVar19 + 1;
      } while (lVar19 == 1);
      lVar14 = (long)local_68 + 1;
    } while (local_68 == (TestNode *)0x0);
    local_50 = local_50 + 1;
  } while (local_50 != 5);
  local_50 = 0;
  do {
    GVar15 = (&DAT_0066c810)[local_50 * 2];
    GVar1 = (&DAT_0066c814)[local_50 * 2];
    lVar14 = 0;
    local_60 = (TestNode *)CONCAT44(local_60._4_4_,GVar15);
    do {
      GVar17 = (&DAT_0066c860)[lVar14 * 2];
      GVar16 = (&DAT_0066c864)[lVar14 * 2];
      lVar19 = 0;
      local_68 = (TestNode *)lVar14;
      do {
        local_88.colorbufferFormat = GVar1;
        local_88.colorbufferType = GVar15;
        local_88.depthbufferFormat = GVar16;
        local_88.depthbufferType = GVar17;
        local_88.stencilbufferFormat = *(GLenum *)((long)&DAT_0066c870 + lVar19 * 8 + 4);
        local_88.stencilbufferType = *(GLenum *)(&DAT_0066c870 + lVar19);
        if ((GVar15 == 0xde1) && (*(GLenum *)(&DAT_0066c870 + lVar19) == 0)) {
          pMVar6 = (MixTest *)operator_new(0xa0);
          FboCases::MixTest::MixTest(pMVar6,(Context *)pTVar5[1]._vptr_TestNode,&local_88,true);
          (pMVar6->super_FboRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
               = (_func_int **)&PTR__TestCase_00794f08;
          tcu::TestNode::addChild(pTVar5,(TestNode *)pMVar6);
          GVar15 = (GLenum)local_60;
        }
        pTVar4 = local_58;
        lVar19 = lVar19 + 1;
      } while (lVar19 == 1);
      lVar14 = (long)local_68 + 1;
    } while (local_68 == (TestNode *)0x0);
    local_50 = local_50 + 1;
  } while (local_50 != 5);
  local_50 = 0;
  do {
    GVar15 = (&DAT_0066c810)[local_50 * 2];
    GVar1 = (&DAT_0066c814)[local_50 * 2];
    lVar14 = 0;
    do {
      GVar17 = (&DAT_0066c860)[lVar14 * 2];
      GVar16 = (&DAT_0066c864)[lVar14 * 2];
      lVar19 = 0;
      local_60 = (TestNode *)CONCAT44(local_60._4_4_,GVar16);
      local_68 = (TestNode *)lVar14;
      do {
        local_88.colorbufferFormat = GVar1;
        local_88.colorbufferType = GVar15;
        local_88.depthbufferFormat = GVar16;
        local_88.depthbufferType = GVar17;
        local_88.stencilbufferFormat = *(GLenum *)((long)&DAT_0066c870 + lVar19 * 8 + 4);
        local_88.stencilbufferType = *(GLenum *)(&DAT_0066c870 + lVar19);
        if (*(GLenum *)(&DAT_0066c870 + lVar19) == 0) {
          pBVar7 = (BlendTest *)operator_new(0x98);
          FboCases::BlendTest::BlendTest(pBVar7,(Context *)pTVar4[1]._vptr_TestNode,&local_88,false)
          ;
          tcu::TestNode::addChild(pTVar4,(TestNode *)pBVar7);
          GVar16 = (GLenum)local_60;
        }
        pTVar5 = local_58;
        lVar19 = lVar19 + 1;
      } while (lVar19 == 1);
      lVar14 = (long)local_68 + 1;
    } while (local_68 == (TestNode *)0x0);
    local_50 = local_50 + 1;
  } while (local_50 != 5);
  lVar14 = 0;
  do {
    GVar15 = (&DAT_0066c810)[lVar14 * 2];
    GVar1 = (&DAT_0066c814)[lVar14 * 2];
    lVar19 = 0;
    local_50 = lVar14;
    do {
      GVar17 = (&DAT_0066c860)[lVar19 * 2];
      GVar16 = (&DAT_0066c864)[lVar19 * 2];
      lVar14 = 0;
      local_60 = (TestNode *)CONCAT44(local_60._4_4_,GVar16);
      local_68 = (TestNode *)lVar19;
      do {
        local_88.colorbufferFormat = GVar1;
        local_88.colorbufferType = GVar15;
        local_88.depthbufferFormat = GVar16;
        local_88.depthbufferType = GVar17;
        local_88.stencilbufferFormat = *(GLenum *)((long)&DAT_0066c870 + lVar14 * 8 + 4);
        local_88.stencilbufferType = *(GLenum *)(&DAT_0066c870 + lVar14);
        if (*(GLenum *)(&DAT_0066c870 + lVar14) == 0) {
          pBVar7 = (BlendTest *)operator_new(0x98);
          FboCases::BlendTest::BlendTest(pBVar7,(Context *)pTVar5[1]._vptr_TestNode,&local_88,true);
          (pBVar7->super_FboRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
               = (_func_int **)&PTR__TestCase_00794f60;
          tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar7);
          GVar16 = (GLenum)local_60;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 == 1);
      lVar19 = (long)local_68 + 1;
    } while (local_68 == (TestNode *)0x0);
    lVar14 = local_50 + 1;
  } while (lVar14 != 5);
  pTVar5 = (TestNode *)operator_new(0x78);
  pTVar4 = local_48;
  pp_Var3 = local_48[1]._vptr_TestNode;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,(TestContext *)*pp_Var3,"depth","Depth bufer tests");
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_00781de0;
  pTVar5[1]._vptr_TestNode = pp_Var3;
  local_58 = pTVar5;
  tcu::TestNode::addChild(pTVar4,pTVar5);
  pTVar4 = local_58;
  local_50 = 0;
  do {
    GVar15 = (&DAT_0066c810)[local_50 * 2];
    GVar1 = (&DAT_0066c814)[local_50 * 2];
    lVar14 = 0;
    do {
      GVar17 = (&DAT_0066c860)[lVar14 * 2];
      GVar16 = (&DAT_0066c864)[lVar14 * 2];
      lVar19 = 0;
      local_60 = (TestNode *)CONCAT44(local_60._4_4_,GVar17);
      local_68 = (TestNode *)lVar14;
      do {
        local_88.colorbufferFormat = GVar1;
        local_88.colorbufferType = GVar15;
        local_88.depthbufferFormat = GVar16;
        local_88.depthbufferType = GVar17;
        local_88.stencilbufferFormat = *(GLenum *)((long)&DAT_0066c870 + lVar19 * 8 + 4);
        local_88.stencilbufferType = *(GLenum *)(&DAT_0066c870 + lVar19);
        if ((GVar17 != 0) && (*(GLenum *)(&DAT_0066c870 + lVar19) == 0)) {
          pIVar8 = (IntersectingQuadsTest *)operator_new(0x98);
          FboCases::IntersectingQuadsTest::IntersectingQuadsTest
                    (pIVar8,(Context *)pTVar4[1]._vptr_TestNode,&local_88,false);
          tcu::TestNode::addChild(pTVar4,(TestNode *)pIVar8);
          GVar17 = (GLenum)local_60;
        }
        pTVar5 = local_58;
        lVar19 = lVar19 + 1;
      } while (lVar19 == 1);
      lVar14 = (long)local_68 + 1;
    } while (local_68 == (TestNode *)0x0);
    local_50 = local_50 + 1;
  } while (local_50 != 5);
  lVar14 = 0;
  do {
    GVar15 = (&DAT_0066c810)[lVar14 * 2];
    GVar1 = (&DAT_0066c814)[lVar14 * 2];
    lVar19 = 0;
    local_50 = lVar14;
    do {
      GVar17 = (&DAT_0066c860)[lVar19 * 2];
      GVar16 = (&DAT_0066c864)[lVar19 * 2];
      lVar14 = 0;
      local_60 = (TestNode *)CONCAT44(local_60._4_4_,GVar17);
      local_68 = (TestNode *)lVar19;
      do {
        local_88.colorbufferFormat = GVar1;
        local_88.colorbufferType = GVar15;
        local_88.depthbufferFormat = GVar16;
        local_88.depthbufferType = GVar17;
        local_88.stencilbufferFormat = *(GLenum *)((long)&DAT_0066c870 + lVar14 * 8 + 4);
        local_88.stencilbufferType = *(GLenum *)(&DAT_0066c870 + lVar14);
        if ((GVar17 != 0) && (*(GLenum *)(&DAT_0066c870 + lVar14) == 0)) {
          pIVar8 = (IntersectingQuadsTest *)operator_new(0x98);
          FboCases::IntersectingQuadsTest::IntersectingQuadsTest
                    (pIVar8,(Context *)pTVar5[1]._vptr_TestNode,&local_88,true);
          (pIVar8->super_FboRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
               = (_func_int **)&PTR__TestCase_00794fb8;
          tcu::TestNode::addChild(pTVar5,(TestNode *)pIVar8);
          GVar17 = (GLenum)local_60;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 == 1);
      lVar19 = (long)local_68 + 1;
    } while (local_68 == (TestNode *)0x0);
    lVar14 = local_50 + 1;
  } while (lVar14 != 5);
  pTVar5 = (TestNode *)operator_new(0x78);
  pTVar4 = local_48;
  pp_Var3 = local_48[1]._vptr_TestNode;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,(TestContext *)*pp_Var3,"stencil","Stencil buffer tests");
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_00781de0;
  pTVar5[1]._vptr_TestNode = pp_Var3;
  tcu::TestNode::addChild(pTVar4,pTVar5);
  local_68 = (TestNode *)0x0;
  do {
    local_58 = (TestNode *)CONCAT44(local_58._4_4_,(&DAT_0066c810)[(long)local_68 * 2]);
    GVar15 = (&DAT_0066c814)[(long)local_68 * 2];
    lVar14 = 0;
    do {
      GVar1 = (&DAT_0066c860)[lVar14 * 2];
      GVar17 = (&DAT_0066c864)[lVar14 * 2];
      lVar19 = 0;
      local_60 = (TestNode *)lVar14;
      do {
        local_88.colorbufferFormat = GVar15;
        local_88.colorbufferType = (GLenum)local_58;
        local_88.depthbufferFormat = GVar17;
        local_88.depthbufferType = GVar1;
        local_88.stencilbufferFormat = *(GLenum *)((long)&DAT_0066c870 + lVar19 * 8 + 4);
        local_88.stencilbufferType = *(GLenum *)(&DAT_0066c870 + lVar19);
        if (*(GLenum *)(&DAT_0066c870 + lVar19) != 0) {
          pSVar9 = (StencilTest *)operator_new(0x98);
          FboCases::StencilTest::StencilTest
                    (pSVar9,(Context *)pTVar5[1]._vptr_TestNode,&local_88,false);
          tcu::TestNode::addChild(pTVar5,(TestNode *)pSVar9);
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 == 1);
      lVar14 = (long)local_60 + 1;
    } while (local_60 == (TestNode *)0x0);
    local_68 = (TestNode *)((long)local_68 + 1);
  } while (local_68 != (TestNode *)0x5);
  lVar14 = 0;
  do {
    local_58 = (TestNode *)CONCAT44(local_58._4_4_,(&DAT_0066c810)[lVar14 * 2]);
    GVar15 = (&DAT_0066c814)[lVar14 * 2];
    lVar19 = 0;
    local_68 = (TestNode *)lVar14;
    do {
      GVar1 = (&DAT_0066c860)[lVar19 * 2];
      GVar17 = (&DAT_0066c864)[lVar19 * 2];
      lVar14 = 0;
      local_60 = (TestNode *)lVar19;
      do {
        local_88.colorbufferFormat = GVar15;
        local_88.colorbufferType = (GLenum)local_58;
        local_88.depthbufferFormat = GVar17;
        local_88.depthbufferType = GVar1;
        local_88.stencilbufferFormat = *(GLenum *)((long)&DAT_0066c870 + lVar14 * 8 + 4);
        local_88.stencilbufferType = *(GLenum *)(&DAT_0066c870 + lVar14);
        if (*(GLenum *)(&DAT_0066c870 + lVar14) != 0) {
          pSVar9 = (StencilTest *)operator_new(0x98);
          FboCases::StencilTest::StencilTest
                    (pSVar9,(Context *)pTVar5[1]._vptr_TestNode,&local_88,true);
          (pSVar9->super_FboRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
               = (_func_int **)&PTR__TestCase_00795010;
          tcu::TestNode::addChild(pTVar5,(TestNode *)pSVar9);
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 == 1);
      lVar19 = (long)local_60 + 1;
    } while (local_60 == (TestNode *)0x0);
    lVar14 = (long)local_68 + 1;
  } while (lVar14 != 5);
  pTVar5 = (TestNode *)operator_new(0x78);
  pTVar4 = local_48;
  pp_Var3 = local_48[1]._vptr_TestNode;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,(TestContext *)*pp_Var3,"shared_colorbuffer_clear",
             "Shared colorbuffer clears");
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_00781de0;
  pTVar5[1]._vptr_TestNode = pp_Var3;
  local_68 = pTVar5;
  tcu::TestNode::addChild(pTVar4,pTVar5);
  pTVar4 = local_68;
  lVar14 = 0;
  do {
    GVar15 = (&DAT_0066c810)[lVar14 * 2];
    GVar1 = (&DAT_0066c814)[lVar14 * 2];
    lVar19 = 0;
    local_40 = lVar14;
    do {
      GVar17 = (&DAT_0066c860)[lVar19 * 2];
      GVar16 = (&DAT_0066c864)[lVar19 * 2];
      bVar18 = GVar17 == 0 && GVar15 != 0;
      lVar14 = 0;
      local_58 = (TestNode *)CONCAT44(local_58._4_4_,GVar16);
      local_60 = (TestNode *)CONCAT71(local_60._1_7_,bVar18);
      local_50 = lVar19;
      do {
        local_88.colorbufferFormat = GVar1;
        local_88.colorbufferType = GVar15;
        local_88.depthbufferFormat = GVar16;
        local_88.depthbufferType = GVar17;
        local_88.stencilbufferFormat = *(GLenum *)((long)&DAT_0066c870 + lVar14 * 8 + 4);
        local_88.stencilbufferType = *(GLenum *)(&DAT_0066c870 + lVar14);
        if ((*(GLenum *)(&DAT_0066c870 + lVar14) == 0 & bVar18) == 1) {
          pTVar5 = (TestNode *)operator_new(0x90);
          FboCases::SharedColorbufferClearsTest::SharedColorbufferClearsTest
                    ((SharedColorbufferClearsTest *)pTVar5,(Context *)pTVar4[1]._vptr_TestNode,
                     &local_88);
          tcu::TestNode::addChild(pTVar4,pTVar5);
          bVar18 = (byte)local_60;
          GVar16 = (GLenum)local_58;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 == 1);
      lVar19 = local_50 + 1;
    } while (local_50 == 0);
    lVar14 = local_40 + 1;
  } while (lVar14 != 5);
  pTVar5 = (TestNode *)operator_new(0x78);
  pTVar4 = local_48;
  pp_Var3 = local_48[1]._vptr_TestNode;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,(TestContext *)*pp_Var3,"shared_colorbuffer",
             "Shared colorbuffer tests");
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_00781de0;
  pTVar5[1]._vptr_TestNode = pp_Var3;
  tcu::TestNode::addChild(pTVar4,pTVar5);
  lVar14 = 0;
  do {
    local_58 = (TestNode *)CONCAT44(local_58._4_4_,(&DAT_0066c810)[lVar14 * 2]);
    GVar15 = (&DAT_0066c814)[lVar14 * 2];
    lVar19 = 0;
    local_68 = (TestNode *)lVar14;
    do {
      GVar1 = (&DAT_0066c860)[lVar19 * 2];
      GVar17 = (&DAT_0066c864)[lVar19 * 2];
      lVar14 = 0;
      local_60 = (TestNode *)lVar19;
      do {
        local_88.colorbufferFormat = GVar15;
        local_88.colorbufferType = (GLenum)local_58;
        local_88.depthbufferFormat = GVar17;
        local_88.depthbufferType = GVar1;
        local_88._16_8_ = (&DAT_0066c870)[lVar14];
        pTVar4 = (TestNode *)operator_new(0x90);
        FboCases::SharedColorbufferTest::SharedColorbufferTest
                  ((SharedColorbufferTest *)pTVar4,(Context *)pTVar5[1]._vptr_TestNode,&local_88);
        tcu::TestNode::addChild(pTVar5,pTVar4);
        lVar14 = lVar14 + 1;
      } while (lVar14 == 1);
      lVar19 = (long)local_60 + 1;
    } while (local_60 == (TestNode *)0x0);
    lVar14 = (long)local_68 + 1;
  } while (lVar14 != 5);
  pTVar5 = (TestNode *)operator_new(0x78);
  pTVar4 = local_48;
  pp_Var3 = local_48[1]._vptr_TestNode;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,(TestContext *)*pp_Var3,"shared_depthbuffer",
             "Shared depthbuffer tests");
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_00781de0;
  pTVar5[1]._vptr_TestNode = pp_Var3;
  local_60 = pTVar5;
  tcu::TestNode::addChild(pTVar4,pTVar5);
  pTVar4 = local_60;
  lVar14 = 0;
  do {
    GVar15 = (&DAT_0066c810)[lVar14 * 2];
    GVar1 = (&DAT_0066c814)[lVar14 * 2];
    lVar19 = 0;
    local_50 = lVar14;
    do {
      GVar17 = (&DAT_0066c860)[lVar19 * 2];
      GVar16 = (&DAT_0066c864)[lVar19 * 2];
      lVar14 = 0;
      local_58 = (TestNode *)CONCAT44(local_58._4_4_,GVar17);
      local_68 = (TestNode *)lVar19;
      do {
        local_88.colorbufferFormat = GVar1;
        local_88.colorbufferType = GVar15;
        local_88.depthbufferFormat = GVar16;
        local_88.depthbufferType = GVar17;
        local_88._16_8_ = (&DAT_0066c870)[lVar14];
        if (GVar17 == 0x8d41) {
          pTVar5 = (TestNode *)operator_new(0x90);
          FboCases::SharedDepthbufferTest::SharedDepthbufferTest
                    ((SharedDepthbufferTest *)pTVar5,(Context *)pTVar4[1]._vptr_TestNode,&local_88);
          tcu::TestNode::addChild(pTVar4,pTVar5);
          GVar17 = (GLenum)local_58;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 == 1);
      lVar19 = (long)local_68 + 1;
    } while (local_68 == (TestNode *)0x0);
    lVar14 = local_50 + 1;
  } while (lVar14 != 5);
  pTVar5 = (TestNode *)operator_new(0x78);
  pTVar4 = local_48;
  pp_Var3 = local_48[1]._vptr_TestNode;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,(TestContext *)*pp_Var3,"resize","FBO resize tests");
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_00781de0;
  pTVar5[1]._vptr_TestNode = pp_Var3;
  tcu::TestNode::addChild(pTVar4,pTVar5);
  lVar14 = 0;
  do {
    local_58 = (TestNode *)CONCAT44(local_58._4_4_,(&DAT_0066c810)[lVar14 * 2]);
    GVar15 = (&DAT_0066c814)[lVar14 * 2];
    lVar19 = 0;
    local_68 = (TestNode *)lVar14;
    do {
      GVar1 = (&DAT_0066c860)[lVar19 * 2];
      GVar17 = (&DAT_0066c864)[lVar19 * 2];
      lVar14 = 0;
      local_60 = (TestNode *)lVar19;
      do {
        local_88.colorbufferFormat = GVar15;
        local_88.colorbufferType = (GLenum)local_58;
        local_88.depthbufferFormat = GVar17;
        local_88.depthbufferType = GVar1;
        local_88._16_8_ = (&DAT_0066c870)[lVar14];
        pTVar4 = (TestNode *)operator_new(0x90);
        FboCases::ResizeTest::ResizeTest
                  ((ResizeTest *)pTVar4,(Context *)pTVar5[1]._vptr_TestNode,&local_88);
        tcu::TestNode::addChild(pTVar5,pTVar4);
        lVar14 = lVar14 + 1;
      } while (lVar14 == 1);
      lVar19 = (long)local_60 + 1;
    } while (local_60 == (TestNode *)0x0);
    lVar14 = (long)local_68 + 1;
  } while (lVar14 != 5);
  pTVar5 = (TestNode *)operator_new(0x78);
  pTVar4 = local_48;
  pp_Var3 = local_48[1]._vptr_TestNode;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,(TestContext *)*pp_Var3,"recreate_colorbuffer",
             "Recreate colorbuffer tests");
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_00781de0;
  pTVar5[1]._vptr_TestNode = pp_Var3;
  tcu::TestNode::addChild(pTVar4,pTVar5);
  local_68 = (TestNode *)0x0;
  do {
    GVar15 = (&DAT_0066c810)[(long)local_68 * 2];
    local_58 = (TestNode *)CONCAT44(local_58._4_4_,(&DAT_0066c814)[(long)local_68 * 2]);
    lVar14 = 0;
    do {
      GVar1 = (&DAT_0066c860)[lVar14 * 2];
      GVar17 = (&DAT_0066c864)[lVar14 * 2];
      lVar19 = 0;
      local_60 = (TestNode *)lVar14;
      do {
        local_88.colorbufferFormat = (GLenum)local_58;
        local_88.colorbufferType = GVar15;
        local_88.depthbufferFormat = GVar17;
        local_88.depthbufferType = GVar1;
        local_88._16_8_ = (&DAT_0066c870)[lVar19];
        if (GVar15 != 0) {
          pRVar10 = (RecreateBuffersTest<16384U> *)operator_new(0x98);
          FboCases::RecreateBuffersTest<16384U>::RecreateBuffersTest
                    (pRVar10,(Context *)pTVar5[1]._vptr_TestNode,&local_88,true);
          (pRVar10->super_FboRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
               = (_func_int **)&PTR__TestCase_00795068;
          tcu::TestNode::addChild(pTVar5,(TestNode *)pRVar10);
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 == 1);
      lVar14 = (long)local_60 + 1;
    } while (local_60 == (TestNode *)0x0);
    local_68 = (TestNode *)((long)local_68 + 1);
  } while (local_68 != (TestNode *)0x5);
  lVar14 = 0;
  do {
    GVar15 = (&DAT_0066c810)[lVar14 * 2];
    local_58 = (TestNode *)CONCAT44(local_58._4_4_,(&DAT_0066c814)[lVar14 * 2]);
    lVar19 = 0;
    local_68 = (TestNode *)lVar14;
    do {
      GVar1 = (&DAT_0066c860)[lVar19 * 2];
      GVar17 = (&DAT_0066c864)[lVar19 * 2];
      lVar14 = 0;
      local_60 = (TestNode *)lVar19;
      do {
        local_88.colorbufferFormat = (GLenum)local_58;
        local_88.colorbufferType = GVar15;
        local_88.depthbufferFormat = GVar17;
        local_88.depthbufferType = GVar1;
        local_88._16_8_ = (&DAT_0066c870)[lVar14];
        if (GVar15 != 0) {
          pRVar10 = (RecreateBuffersTest<16384U> *)operator_new(0x98);
          FboCases::RecreateBuffersTest<16384U>::RecreateBuffersTest
                    (pRVar10,(Context *)pTVar5[1]._vptr_TestNode,&local_88,false);
          (pRVar10->super_FboRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
               = (_func_int **)&PTR__TestCase_00795118;
          tcu::TestNode::addChild(pTVar5,(TestNode *)pRVar10);
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 == 1);
      lVar19 = (long)local_60 + 1;
    } while (local_60 == (TestNode *)0x0);
    lVar14 = (long)local_68 + 1;
  } while (lVar14 != 5);
  pTVar5 = (TestNode *)operator_new(0x78);
  pTVar4 = local_48;
  pp_Var3 = local_48[1]._vptr_TestNode;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,(TestContext *)*pp_Var3,"recreate_depthbuffer",
             "Recreate depthbuffer tests");
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_00781de0;
  pTVar5[1]._vptr_TestNode = pp_Var3;
  tcu::TestNode::addChild(pTVar4,pTVar5);
  local_68 = (TestNode *)0x0;
  do {
    local_58 = (TestNode *)CONCAT44(local_58._4_4_,(&DAT_0066c810)[(long)local_68 * 2]);
    GVar15 = (&DAT_0066c814)[(long)local_68 * 2];
    lVar14 = 0;
    do {
      GVar1 = (&DAT_0066c860)[lVar14 * 2];
      GVar17 = (&DAT_0066c864)[lVar14 * 2];
      lVar19 = 0;
      local_60 = (TestNode *)lVar14;
      do {
        local_88.colorbufferFormat = GVar15;
        local_88.colorbufferType = (GLenum)local_58;
        local_88.depthbufferFormat = GVar17;
        local_88.depthbufferType = GVar1;
        local_88._16_8_ = (&DAT_0066c870)[lVar19];
        if (GVar1 != 0) {
          pRVar11 = (RecreateBuffersTest<256U> *)operator_new(0x98);
          FboCases::RecreateBuffersTest<256U>::RecreateBuffersTest
                    (pRVar11,(Context *)pTVar5[1]._vptr_TestNode,&local_88,true);
          (pRVar11->super_FboRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
               = (_func_int **)&PTR__TestCase_00795170;
          tcu::TestNode::addChild(pTVar5,(TestNode *)pRVar11);
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 == 1);
      lVar14 = (long)local_60 + 1;
    } while (local_60 == (TestNode *)0x0);
    local_68 = (TestNode *)((long)local_68 + 1);
  } while (local_68 != (TestNode *)0x5);
  lVar14 = 0;
  do {
    local_58 = (TestNode *)CONCAT44(local_58._4_4_,(&DAT_0066c810)[lVar14 * 2]);
    GVar15 = (&DAT_0066c814)[lVar14 * 2];
    lVar19 = 0;
    local_68 = (TestNode *)lVar14;
    do {
      GVar1 = (&DAT_0066c860)[lVar19 * 2];
      GVar17 = (&DAT_0066c864)[lVar19 * 2];
      lVar14 = 0;
      local_60 = (TestNode *)lVar19;
      do {
        local_88.colorbufferFormat = GVar15;
        local_88.colorbufferType = (GLenum)local_58;
        local_88.depthbufferFormat = GVar17;
        local_88.depthbufferType = GVar1;
        local_88._16_8_ = (&DAT_0066c870)[lVar14];
        if (GVar1 != 0) {
          pRVar11 = (RecreateBuffersTest<256U> *)operator_new(0x98);
          FboCases::RecreateBuffersTest<256U>::RecreateBuffersTest
                    (pRVar11,(Context *)pTVar5[1]._vptr_TestNode,&local_88,false);
          (pRVar11->super_FboRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
               = (_func_int **)&PTR__TestCase_00795220;
          tcu::TestNode::addChild(pTVar5,(TestNode *)pRVar11);
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 == 1);
      lVar19 = (long)local_60 + 1;
    } while (local_60 == (TestNode *)0x0);
    lVar14 = (long)local_68 + 1;
  } while (lVar14 != 5);
  pTVar5 = (TestNode *)operator_new(0x78);
  pTVar4 = local_48;
  pp_Var3 = local_48[1]._vptr_TestNode;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,(TestContext *)*pp_Var3,"recreate_stencilbuffer",
             "Recreate stencilbuffer tests");
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_00781de0;
  pTVar5[1]._vptr_TestNode = pp_Var3;
  tcu::TestNode::addChild(pTVar4,pTVar5);
  local_68 = (TestNode *)0x0;
  do {
    local_58 = (TestNode *)CONCAT44(local_58._4_4_,(&DAT_0066c810)[(long)local_68 * 2]);
    GVar15 = (&DAT_0066c814)[(long)local_68 * 2];
    lVar14 = 0;
    do {
      GVar1 = (&DAT_0066c860)[lVar14 * 2];
      GVar17 = (&DAT_0066c864)[lVar14 * 2];
      lVar19 = 0;
      local_60 = (TestNode *)lVar14;
      do {
        local_88.colorbufferFormat = GVar15;
        local_88.colorbufferType = (GLenum)local_58;
        local_88.depthbufferFormat = GVar17;
        local_88.depthbufferType = GVar1;
        local_88.stencilbufferFormat = *(GLenum *)((long)&DAT_0066c870 + lVar19 * 8 + 4);
        local_88.stencilbufferType = *(GLenum *)(&DAT_0066c870 + lVar19);
        if (*(GLenum *)(&DAT_0066c870 + lVar19) != 0) {
          pRVar12 = (RecreateBuffersTest<1024U> *)operator_new(0x98);
          FboCases::RecreateBuffersTest<1024U>::RecreateBuffersTest
                    (pRVar12,(Context *)pTVar5[1]._vptr_TestNode,&local_88,true);
          (pRVar12->super_FboRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
               = (_func_int **)&PTR__TestCase_00795278;
          tcu::TestNode::addChild(pTVar5,(TestNode *)pRVar12);
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 == 1);
      lVar14 = (long)local_60 + 1;
    } while (local_60 == (TestNode *)0x0);
    local_68 = (TestNode *)((long)local_68 + 1);
  } while (local_68 != (TestNode *)0x5);
  lVar14 = 0;
  do {
    local_58 = (TestNode *)CONCAT44(local_58._4_4_,(&DAT_0066c810)[lVar14 * 2]);
    GVar15 = (&DAT_0066c814)[lVar14 * 2];
    lVar19 = 0;
    local_68 = (TestNode *)lVar14;
    do {
      GVar1 = (&DAT_0066c860)[lVar19 * 2];
      GVar17 = (&DAT_0066c864)[lVar19 * 2];
      lVar14 = 0;
      local_60 = (TestNode *)lVar19;
      do {
        local_88.colorbufferFormat = GVar15;
        local_88.colorbufferType = (GLenum)local_58;
        local_88.depthbufferFormat = GVar17;
        local_88.depthbufferType = GVar1;
        local_88.stencilbufferFormat = *(GLenum *)((long)&DAT_0066c870 + lVar14 * 8 + 4);
        local_88.stencilbufferType = *(GLenum *)(&DAT_0066c870 + lVar14);
        if (*(GLenum *)(&DAT_0066c870 + lVar14) != 0) {
          pRVar12 = (RecreateBuffersTest<1024U> *)operator_new(0x98);
          FboCases::RecreateBuffersTest<1024U>::RecreateBuffersTest
                    (pRVar12,(Context *)pTVar5[1]._vptr_TestNode,&local_88,false);
          (pRVar12->super_FboRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
               = (_func_int **)&PTR__TestCase_00795328;
          tcu::TestNode::addChild(pTVar5,(TestNode *)pRVar12);
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 == 1);
      lVar19 = (long)local_60 + 1;
    } while (local_60 == (TestNode *)0x0);
    lVar14 = (long)local_68 + 1;
  } while (lVar14 != 5);
  pTVar5 = (TestNode *)operator_new(0x78);
  pTVar4 = local_48;
  pp_Var3 = local_48[1]._vptr_TestNode;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,(TestContext *)*pp_Var3,"texsubimage",
             "TexSubImage interop with FBO colorbuffer texture");
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_00781de0;
  pTVar5[1]._vptr_TestNode = pp_Var3;
  local_58 = pTVar5;
  tcu::TestNode::addChild(pTVar4,pTVar5);
  pTVar4 = local_58;
  local_38 = 0;
  do {
    GVar15 = (&DAT_0066c810)[local_38 * 2];
    GVar1 = (&DAT_0066c814)[local_38 * 2];
    local_40 = CONCAT71(local_40._1_7_,GVar1 - 0x1907 < 2 && GVar15 == 0xde1);
    lVar14 = 0;
    do {
      GVar17 = (&DAT_0066c860)[lVar14 * 2];
      GVar16 = (&DAT_0066c864)[lVar14 * 2];
      bVar18 = GVar17 == 0 & (byte)local_40;
      lVar19 = 0;
      local_60 = (TestNode *)CONCAT44(local_60._4_4_,GVar16);
      local_68 = (TestNode *)CONCAT71(local_68._1_7_,bVar18);
      local_50 = lVar14;
      do {
        local_88.colorbufferFormat = GVar1;
        local_88.colorbufferType = GVar15;
        local_88.depthbufferFormat = GVar16;
        local_88.depthbufferType = GVar17;
        local_88.stencilbufferFormat = *(GLenum *)((long)&DAT_0066c870 + lVar19 * 8 + 4);
        local_88.stencilbufferType = *(GLenum *)(&DAT_0066c870 + lVar19);
        if ((*(GLenum *)(&DAT_0066c870 + lVar19) == 0 & bVar18) == 1) {
          pTVar5 = (TestNode *)operator_new(0x90);
          FboCases::TexSubImageAfterRenderTest::TexSubImageAfterRenderTest
                    ((TexSubImageAfterRenderTest *)pTVar5,(Context *)pTVar4[1]._vptr_TestNode,
                     &local_88);
          tcu::TestNode::addChild(pTVar4,pTVar5);
          bVar18 = (byte)local_68;
          GVar16 = (GLenum)local_60;
        }
        pTVar5 = local_58;
        lVar19 = lVar19 + 1;
      } while (lVar19 == 1);
      lVar14 = local_50 + 1;
    } while (local_50 == 0);
    local_38 = local_38 + 1;
  } while (local_38 != 5);
  lVar14 = 0;
  do {
    GVar15 = (&DAT_0066c810)[lVar14 * 2];
    GVar1 = (&DAT_0066c814)[lVar14 * 2];
    local_40 = CONCAT71(local_40._1_7_,GVar1 - 0x1907 < 2 && GVar15 == 0xde1);
    lVar19 = 0;
    local_38 = lVar14;
    do {
      GVar17 = (&DAT_0066c860)[lVar19 * 2];
      GVar16 = (&DAT_0066c864)[lVar19 * 2];
      bVar18 = GVar17 == 0 & (byte)local_40;
      lVar14 = 0;
      local_60 = (TestNode *)CONCAT44(local_60._4_4_,GVar16);
      local_68 = (TestNode *)CONCAT71(local_68._1_7_,bVar18);
      local_50 = lVar19;
      do {
        local_88.colorbufferFormat = GVar1;
        local_88.colorbufferType = GVar15;
        local_88.depthbufferFormat = GVar16;
        local_88.depthbufferType = GVar17;
        local_88.stencilbufferFormat = *(GLenum *)((long)&DAT_0066c870 + lVar14 * 8 + 4);
        local_88.stencilbufferType = *(GLenum *)(&DAT_0066c870 + lVar14);
        if ((*(GLenum *)(&DAT_0066c870 + lVar14) == 0 & bVar18) == 1) {
          pTVar4 = (TestNode *)operator_new(0x90);
          FboCases::TexSubImageBetweenRenderTest::TexSubImageBetweenRenderTest
                    ((TexSubImageBetweenRenderTest *)pTVar4,(Context *)pTVar5[1]._vptr_TestNode,
                     &local_88);
          tcu::TestNode::addChild(pTVar5,pTVar4);
          bVar18 = (byte)local_68;
          GVar16 = (GLenum)local_60;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 == 1);
      lVar19 = local_50 + 1;
    } while (local_50 == 0);
    lVar14 = local_38 + 1;
  } while (lVar14 != 5);
  pTVar5 = (TestNode *)operator_new(0x70);
  pTVar4 = local_48;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,local_48->m_testCtx,"repeated_clear","Repeated FBO clears");
  tcu::TestNode::addChild(pTVar4,pTVar5);
  pTVar13 = (TestNode *)operator_new(0x90);
  FboCases::RepeatedClearCase::RepeatedClearCase
            ((RepeatedClearCase *)pTVar13,(Context *)pTVar4[1]._vptr_TestNode,0x1907);
  tcu::TestNode::addChild(pTVar5,pTVar13);
  pTVar13 = (TestNode *)operator_new(0x90);
  FboCases::RepeatedClearCase::RepeatedClearCase
            ((RepeatedClearCase *)pTVar13,(Context *)pTVar4[1]._vptr_TestNode,0x1908);
  tcu::TestNode::addChild(pTVar5,pTVar13);
  return extraout_EAX;
}

Assistant:

void FboRenderTestGroup::init (void)
{
	createChildGroup<FboCases::ColorClearsTest>					(this, "color_clear",		"Color buffer clears");
	createChildGroup<FboCases::StencilClearsTest>				(this, "stencil_clear",		"Stencil buffer clears");

	deqp::gles2::TestCaseGroup* colorGroup = new deqp::gles2::TestCaseGroup(m_context, "color", "Color buffer tests");
	addChild(colorGroup);
	addChildVariants<FboCases::MixTest>			(colorGroup);
	addChildVariants<FboCases::MixNpotTest>		(colorGroup);
	addChildVariants<FboCases::BlendTest>		(colorGroup);
	addChildVariants<FboCases::BlendNpotTest>	(colorGroup);

	deqp::gles2::TestCaseGroup* depthGroup = new deqp::gles2::TestCaseGroup(m_context, "depth", "Depth bufer tests");
	addChild(depthGroup);
	addChildVariants<FboCases::IntersectingQuadsTest>		(depthGroup);
	addChildVariants<FboCases::IntersectingQuadsNpotTest>	(depthGroup);

	deqp::gles2::TestCaseGroup* stencilGroup = new deqp::gles2::TestCaseGroup(m_context, "stencil", "Stencil buffer tests");
	addChild(stencilGroup);
	addChildVariants<FboCases::StencilTest>		(stencilGroup);
	addChildVariants<FboCases::StencilNpotTest>	(stencilGroup);

	createChildGroup<FboCases::SharedColorbufferClearsTest>		(this, "shared_colorbuffer_clear",	"Shared colorbuffer clears");
	createChildGroup<FboCases::SharedColorbufferTest>			(this, "shared_colorbuffer",		"Shared colorbuffer tests");
	createChildGroup<FboCases::SharedDepthbufferTest>			(this, "shared_depthbuffer",		"Shared depthbuffer tests");
	createChildGroup<FboCases::ResizeTest>						(this, "resize",					"FBO resize tests");

	createRecreateBuffersGroup<GL_COLOR_BUFFER_BIT>				(this, "recreate_colorbuffer",		"Recreate colorbuffer tests");
	createRecreateBuffersGroup<GL_DEPTH_BUFFER_BIT>				(this, "recreate_depthbuffer",		"Recreate depthbuffer tests");
	createRecreateBuffersGroup<GL_STENCIL_BUFFER_BIT>			(this, "recreate_stencilbuffer",	"Recreate stencilbuffer tests");

	deqp::gles2::TestCaseGroup* texSubImageGroup = new deqp::gles2::TestCaseGroup(m_context, "texsubimage", "TexSubImage interop with FBO colorbuffer texture");
	addChild(texSubImageGroup);
	addChildVariants<FboCases::TexSubImageAfterRenderTest>		(texSubImageGroup);
	addChildVariants<FboCases::TexSubImageBetweenRenderTest>	(texSubImageGroup);

	{
		tcu::TestCaseGroup* const repeatedClearGroup = new tcu::TestCaseGroup(m_testCtx, "repeated_clear", "Repeated FBO clears");
		addChild(repeatedClearGroup);

		repeatedClearGroup->addChild(new FboCases::RepeatedClearCase(m_context, GL_RGB));
		repeatedClearGroup->addChild(new FboCases::RepeatedClearCase(m_context, GL_RGBA));
	}
}